

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O2

UnicodeSet * __thiscall icu_63::UnicodeSet::complement(UnicodeSet *this,UnicodeString *s)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  int32_t start;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (s->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (((iVar3 != 0) &&
      (this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0)) &&
     ((this->fFlags & 1) == 0)) {
    start = getSingleCP(s);
    if (start < 0) {
      UVar2 = UVector::contains(this->strings,s);
      if (UVar2 == '\0') {
        _add(this,s);
      }
      else {
        UVector::removeElement(this->strings,s);
      }
      releasePattern(this);
    }
    else {
      complement(this,start,start);
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::complement(const UnicodeString& s) {
    if (s.length() == 0 || isFrozen() || isBogus()) return *this;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        if (strings->contains((void*) &s)) {
            strings->removeElement((void*) &s);
        } else {
            _add(s);
        }
        releasePattern();
    } else {
        complement((UChar32)cp, (UChar32)cp);
    }
    return *this;
}